

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhinull.cpp
# Opt level: O1

bool __thiscall QNullTexture::create(QNullTexture *this)

{
  uint uVar1;
  QRhiImplementation *pQVar2;
  void *pvVar3;
  QImageData *pQVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QSize size;
  QRhiResource *copy;
  uint local_b4;
  long local_b0;
  QSize local_80;
  QImage local_78;
  QSize local_60;
  undefined1 local_58 [16];
  QImageData *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->super_QRhiTexture).field_0x64 == '\x01') {
    (*(this->super_QRhiTexture).super_QRhiResource._vptr_QRhiResource[3])(this);
  }
  (this->super_QRhiTexture).field_0x64 = 1;
  pQVar2 = (this->super_QRhiTexture).super_QRhiResource.m_rhi;
  uVar1 = (this->super_QRhiTexture).m_flags.super_QFlagsStorageHelper<QRhiTexture::Flag,_4>.
          super_QFlagsStorage<QRhiTexture::Flag>.i;
  local_60.wd.m_i = (this->super_QRhiTexture).m_pixelSize.wd.m_i;
  if ((uVar1 >> 0xd & 1) == 0) {
    if ((local_60.wd.m_i < 1) || ((this->super_QRhiTexture).m_pixelSize.ht.m_i < 1)) {
      local_60.wd.m_i = 1;
      local_60.ht.m_i = 1;
    }
    else {
      local_60 = (this->super_QRhiTexture).m_pixelSize;
    }
  }
  else {
    if (local_60.wd.m_i < 2) {
      local_60.wd.m_i = 1;
    }
    local_60.ht.m_i = 1;
  }
  local_b4 = 1;
  if ((uVar1 & 8) != 0) {
    local_b4 = QRhi::mipLevelsForSize(&local_60);
  }
  if ((uVar1 >> 10 & 1) == 0) {
    if ((uVar1 & 0x1004) == 0x1000) {
      uVar1 = (this->super_QRhiTexture).m_arraySize;
      uVar6 = 0;
      if (0 < (int)uVar1) {
        uVar6 = uVar1;
      }
    }
    else {
      uVar6 = ((uVar1 & 4) >> 2) * 5 + 1;
    }
  }
  else {
    uVar1 = (this->super_QRhiTexture).m_depth;
    uVar6 = 1;
    if (1 < (int)uVar1) {
      uVar6 = uVar1;
    }
  }
  if ((this->super_QRhiTexture).m_format == RGBA8) {
    QVLABase<std::array<QImage,_16UL>_>::resize_impl
              (&(this->image).super_QVLABase<std::array<QImage,_16UL>_>,6,
               &(this->image).super_QVLAStorage<384UL,_8UL,_6LL>,(ulong)uVar6);
    if (uVar6 != 0) {
      local_b0 = 0;
      uVar5 = 0;
      do {
        if (0 < (int)local_b4) {
          uVar8 = 0;
          lVar7 = local_b0;
          do {
            local_80 = QRhi::sizeForMipLevel((int)uVar8,&local_60);
            QImage::QImage(&local_78,&local_80,Format_RGBA8888_Premultiplied);
            if (uVar8 == 0x10) {
              create();
              goto LAB_004629a0;
            }
            pvVar3 = (this->image).super_QVLABase<std::array<QImage,_16UL>_>.super_QVLABaseBase.ptr;
            local_48 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
            local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            QPaintDevice::QPaintDevice((QPaintDevice *)local_58);
            pQVar4 = local_78.d;
            local_58._0_8_ = &PTR__QImage_007e2f38;
            local_78.d = (QImageData *)0x0;
            local_48 = *(QImageData **)((long)pvVar3 + lVar7 + 0x10);
            *(QImageData **)((long)pvVar3 + lVar7 + 0x10) = pQVar4;
            QImage::~QImage((QImage *)local_58);
            QImage::~QImage(&local_78);
            QImage::fill((QImage *)
                         ((long)(this->image).super_QVLABase<std::array<QImage,_16UL>_>.
                                super_QVLABaseBase.ptr + lVar7),yellow);
            uVar8 = uVar8 + 1;
            lVar7 = lVar7 + 0x18;
          } while (local_b4 != uVar8);
        }
        uVar5 = uVar5 + 1;
        local_b0 = local_b0 + 0x180;
      } while (uVar5 != uVar6);
    }
  }
  this->generation = this->generation + 1;
  local_78.super_QPaintDevice._vptr_QPaintDevice._0_1_ = 1;
  local_58._0_8_ = this;
  QHash<QRhiResource*,bool>::emplace<bool_const&>
            ((QHash<QRhiResource*,bool> *)&pQVar2->resources,(QRhiResource **)local_58,
             (bool *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return true;
  }
LAB_004629a0:
  __stack_chk_fail();
}

Assistant:

bool QNullTexture::create()
{
    if (valid)
        destroy();

    valid = true;

    QRHI_RES_RHI(QRhiNull);
    const bool isCube = m_flags.testFlag(CubeMap);
    const bool is3D = m_flags.testFlag(ThreeDimensional);
    const bool isArray = m_flags.testFlag(TextureArray);
    const bool hasMipMaps = m_flags.testFlag(MipMapped);
    const bool is1D = m_flags.testFlags(OneDimensional);
    QSize size = is1D ? QSize(qMax(1, m_pixelSize.width()), 1)
                      : (m_pixelSize.isEmpty() ? QSize(1, 1) : m_pixelSize);
    const int mipLevelCount = hasMipMaps ? rhiD->q->mipLevelsForSize(size) : 1;
    const int layerCount = is3D ? qMax(1, m_depth)
                                : (isCube ? 6
                                          : (isArray ? qMax(0, m_arraySize)
                                                     : 1));

    if (m_format == RGBA8) {
        image.resize(layerCount);
        for (int layer = 0; layer < layerCount; ++layer) {
            for (int level = 0; level < mipLevelCount; ++level) {
                image[layer][level] = QImage(rhiD->q->sizeForMipLevel(level, size),
                                             QImage::Format_RGBA8888_Premultiplied);
                image[layer][level].fill(Qt::yellow);
            }
        }
    }

    generation += 1;

    rhiD->registerResource(this);

    return true;
}